

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

XMLNode * XMLNode_get_child(XMLNode *node,int i_child)

{
  uint uVar1;
  ulong uVar2;
  
  if (node != (XMLNode *)0x0) {
    if (i_child < 0) {
      return (XMLNode *)0x0;
    }
    if (node->init_value != 0x19770522) {
      return (XMLNode *)0x0;
    }
    uVar1 = node->n_children;
    if (0 < (int)uVar1 && i_child < (int)uVar1) {
      uVar2 = 0;
      do {
        if (node->children[uVar2]->active == 0) {
          i_child = i_child + 1;
        }
        else if (uVar2 == (uint)i_child) {
          return node->children[uVar2];
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLNode_get_child(const XMLNode* node, int i_child)
{
	int i;
	
	if (node == NULL || node->init_value != XML_INIT_DONE || i_child < 0 || i_child >= node->n_children)
		return NULL;
	
	for (i = 0; i < node->n_children; i++) {
		if (!node->children[i]->active)
			i_child++;
		else if (i == i_child)
			return node->children[i];
	}
	
	return NULL;
}